

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLReader::getName(XMLReader *this,XMLBuffer *toFill,bool token)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  
  uVar6 = this->fCharIndex;
  if (uVar6 == this->fCharsAvail) {
    bVar1 = refreshCharBuffer(this);
    if (!bVar1) {
      return false;
    }
    uVar6 = this->fCharIndex;
  }
  uVar4 = uVar6;
  if (!token) {
    if ((ushort)(this->fCharBuf[uVar6] + L'⠀') < 0x380) {
      XVar5 = uVar6 + 1;
      if (XVar5 == this->fCharsAvail) {
        bVar1 = refreshCharBuffer(this);
        if (!bVar1) {
          return false;
        }
        uVar6 = this->fCharIndex;
        XVar5 = uVar6 + 1;
      }
      if ((ushort)(this->fCharBuf[XVar5] + L'\x2000') < 0xfc00) {
        return false;
      }
      uVar2 = uVar6 + 2;
      uVar4 = uVar6;
    }
    else {
      if ((this->fgCharCharsTable[(ushort)this->fCharBuf[uVar6]] & 2) == 0) {
        return false;
      }
      uVar2 = uVar6 + 1;
    }
    this->fCharIndex = uVar2;
    uVar6 = uVar2;
  }
  do {
    uVar2 = this->fCharsAvail;
    while (uVar6 < uVar2) {
      if ((ushort)(this->fCharBuf[uVar6] + L'⠀') < 0x380) {
        uVar3 = uVar6 + 1;
        if (uVar3 == uVar2) {
          XVar5 = uVar6 - uVar4;
          if (XVar5 != 0) {
            this->fCurCol = this->fCurCol + XVar5;
            XMLBuffer::append(toFill,this->fCharBuf + uVar4,XVar5);
          }
          bVar1 = refreshCharBuffer(this);
          uVar6 = this->fCharIndex;
          if (!bVar1) break;
          uVar3 = uVar6 + 1;
          uVar4 = uVar6;
        }
        if ((ushort)(this->fCharBuf[uVar3] + L'\x2000') < 0xfc00) break;
        uVar6 = uVar6 + 2;
        uVar2 = this->fCharsAvail;
      }
      else {
        if ((this->fgCharCharsTable[(ushort)this->fCharBuf[uVar6]] & 4) == 0) break;
        uVar6 = uVar6 + 1;
      }
      this->fCharIndex = uVar6;
    }
    XVar5 = uVar6 - uVar4;
    if (XVar5 != 0) {
      this->fCurCol = this->fCurCol + XVar5;
      XMLBuffer::append(toFill,this->fCharBuf + uVar4,XVar5);
      uVar6 = this->fCharIndex;
    }
    if ((uVar6 < this->fCharsAvail) || (bVar1 = refreshCharBuffer(this), !bVar1)) {
      return toFill->fIndex != 0;
    }
    uVar6 = this->fCharIndex;
    uVar4 = this->fCharIndex;
  } while( true );
}

Assistant:

bool XMLReader::getName(XMLBuffer& toFill, const bool token)
{
    //  Ok, first lets see if we have chars in the buffer. If not, then lets
    //  reload.
    if (fCharIndex == fCharsAvail)
    {
        if (!refreshCharBuffer())
            return false;
    }

    XMLSize_t charIndex_start = fCharIndex;

    //  Lets check the first char for being a first name char. If not, then
    //  what's the point in living mannnn? Just give up now. We only do this
    //  if its a name and not a name token that they want.
    if (!token)
    {
        if ((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F)) {
            // if there isn't one more char in the buffer, read more data
            if (fCharIndex+1 == fCharsAvail)
            {
                if (!refreshCharBuffer())
                    return false;
                // reset the start buffer to the new location of the cursor
                charIndex_start = fCharIndex;
            }
            if ((fCharBuf[fCharIndex+1] < 0xDC00) || (fCharBuf[fCharIndex+1] > 0xDFFF))
                return false;

            // Looks ok, so lets eat it
            fCharIndex += 2;
        }
        else {
            if (!isFirstNameChar(fCharBuf[fCharIndex]))
                return false;

            // Looks ok, so lets eat it
            fCharIndex ++;
        }

    }

    //  And now we loop until we run out of data in this reader or we hit
    //  a non-name char.
    while (true)
    {
        while (fCharIndex < fCharsAvail)
        {
            //  Check the current char and take it if its a name char. Else
            //  break out.
            if ( (fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F) )
            {
                // if there isn't one more char in the buffer, read more data
                if (fCharIndex+1 == fCharsAvail)
                {
                    // but first copy the accepted character(s), and update column
                    if (fCharIndex != charIndex_start)
                    {
                        fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
                        toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
                    }

                    if (!refreshCharBuffer())
                        break;

                    charIndex_start = fCharIndex;
                }
                if ( (fCharBuf[fCharIndex+1] < 0xDC00) ||
                        (fCharBuf[fCharIndex+1] > 0xDFFF)  )
                    break;
                fCharIndex += 2;

            }
            else
            {
                if (!isNameChar(fCharBuf[fCharIndex]))
                    break;
                fCharIndex++;
            }
        }

        // we have to copy the accepted character(s), and update column
        if (fCharIndex != charIndex_start)
        {
            fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
            toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
        }

        // something is wrong if there is still something in the buffer
        // or if we don't get no more, then break out.
        if ((fCharIndex < fCharsAvail) ||
             !refreshCharBuffer())
            break;

        charIndex_start = fCharIndex;
    }

    return !toFill.isEmpty();
}